

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_update_from_json_data(qpdf_data qpdf,char *buffer,unsigned_long_long size)

{
  QPDF_ERROR_CODE QVar1;
  char *qpdf_00;
  Buffer *this;
  uchar *buf;
  size_t size_00;
  anon_class_8_1_3fcf65e8 local_80;
  function<void_(_qpdf_data_*)> local_78;
  undefined1 local_51;
  undefined1 local_50 [8];
  shared_ptr<BufferInputSource> is;
  Buffer *local_30;
  Buffer *b;
  unsigned_long_long uStack_20;
  QPDF_ERROR_CODE status;
  unsigned_long_long size_local;
  char *buffer_local;
  qpdf_data qpdf_local;
  
  b._4_4_ = 0;
  uStack_20 = size;
  size_local = (unsigned_long_long)buffer;
  buffer_local = (char *)qpdf;
  this = (Buffer *)operator_new(8);
  buf = QUtil::unsigned_char_pointer((char *)size_local);
  size_00 = QIntC::to_size<unsigned_long_long>(&stack0xffffffffffffffe0);
  Buffer::Buffer(this,buf,size_00);
  local_51 = 1;
  local_30 = this;
  std::make_shared<BufferInputSource,char_const*&,Buffer*&,bool>
            ((char **)local_50,(Buffer **)(buffer_local + 0x78),(bool *)&local_30);
  qpdf_00 = buffer_local;
  local_80.is = (shared_ptr<BufferInputSource> *)local_50;
  std::function<void(_qpdf_data*)>::function<qpdf_update_from_json_data::__0,void>
            ((function<void(_qpdf_data*)> *)&local_78,&local_80);
  b._4_4_ = trap_errors((qpdf_data)qpdf_00,&local_78);
  std::function<void_(_qpdf_data_*)>::~function(&local_78);
  QVar1 = b._4_4_;
  std::shared_ptr<BufferInputSource>::~shared_ptr((shared_ptr<BufferInputSource> *)local_50);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_update_from_json_data(qpdf_data qpdf, char const* buffer, unsigned long long size)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    auto b = new Buffer(QUtil::unsigned_char_pointer(buffer), QIntC::to_size(size));
    auto is = std::make_shared<BufferInputSource>(qpdf->filename, b, true);
    status = trap_errors(qpdf, [&is](qpdf_data q) { q->qpdf->updateFromJSON(is); });
    return status;
}